

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_to_proto_test.cc
# Opt level: O0

void __thiscall
upb_test::FuzzTest_NegativeOneofIndex_Test::FuzzTest_NegativeOneofIndex_Test
          (FuzzTest_NegativeOneofIndex_Test *this)

{
  FuzzTest_NegativeOneofIndex_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__FuzzTest_NegativeOneofIndex_Test_00a15470;
  return;
}

Assistant:

TEST(FuzzTest, NegativeOneofIndex) {
  RoundTripDescriptor(ParseTextProtoOrDie(
      R"pb(file {
             message_type {
               name: "A"
               field { name: "A" number: 0 type_name: "" oneof_index: -1 }
             }
           }
      )pb"));
}